

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O2

void nosimd::arithmetic::divC<unsigned_char>(uchar *pSrc,uchar val,uchar *pDst,int len)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (0 < len) {
    uVar2 = (ulong)(uint)len;
  }
  uVar1 = 0;
  if (pSrc == pDst) {
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      pDst[uVar1] = pDst[uVar1] / val;
    }
  }
  else {
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      pDst[uVar1] = pSrc[uVar1] / val;
    }
  }
  return;
}

Assistant:

inline void divC(const _T * pSrc, _T val, _T * pDst, int len)
        {
            if (pSrc == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] /= val;
            }
            else
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] = pSrc[i] / val;
            }
        }